

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O3

int ebur128_gated_loudness(ebur128_state **sts,size_t size,double *out)

{
  double dVar1;
  ebur128_state_internal *peVar2;
  unsigned_long uVar3;
  size_t sVar4;
  ulong uVar5;
  size_t index_max;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  ebur128_dq_entry *peVar9;
  long lVar10;
  double dVar11;
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double local_48;
  size_t local_40;
  double local_38;
  
  local_38 = 0.0;
  local_40 = 0;
  local_48 = -INFINITY;
  if (size != 0) {
    sVar4 = 0;
    do {
      if ((sts[sVar4] != (ebur128_state *)0x0) && ((~sts[sVar4]->mode & 5U) != 0)) {
        return 2;
      }
      sVar4 = sVar4 + 1;
    } while (size != sVar4);
    local_48 = -INFINITY;
    sVar4 = 0;
    do {
      if (sts[sVar4] != (ebur128_state *)0x0) {
        ebur128_calc_relative_threshold((ebur128_state *)sts[sVar4]->d,&local_40,&local_38);
      }
      sVar4 = sVar4 + 1;
    } while (size != sVar4);
    if (local_40 != 0) {
      auVar12._8_4_ = (int)(local_40 >> 0x20);
      auVar12._0_8_ = local_40;
      auVar12._12_4_ = 0x45300000;
      dVar13 = (local_38 /
               ((auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)local_40) - 4503599627370496.0))) *
               relative_gate_factor;
      if (histogram_energy_boundaries[0] <= dVar13) {
        uVar5 = 0;
        uVar6 = 1000;
        do {
          uVar7 = uVar5 + uVar6 >> 1;
          if (histogram_energy_boundaries[uVar7] <= dVar13) {
            uVar5 = uVar7;
            uVar7 = uVar6;
          }
          uVar6 = uVar7;
        } while (uVar7 - uVar5 != 1);
        if (size == 0) goto LAB_00107695;
        uVar5 = uVar5 + (histogram_energies[uVar5] <= dVar13 && dVar13 != histogram_energies[uVar5])
        ;
      }
      else {
        uVar5 = 0;
      }
      dVar11 = 0.0;
      sVar4 = 0;
      lVar8 = 0;
      do {
        if (sts[sVar4] != (ebur128_state *)0x0) {
          peVar2 = sts[sVar4]->d;
          if (peVar2->use_histogram == 0) {
            for (peVar9 = (peVar2->block_list).stqh_first; peVar9 != (ebur128_dq_entry *)0x0;
                peVar9 = (peVar9->entries).stqe_next) {
              dVar1 = peVar9->z;
              lVar8 = (lVar8 + 1) - (ulong)(dVar1 < dVar13);
              if (dVar13 <= dVar1) {
                dVar11 = dVar11 + dVar1;
              }
            }
          }
          else if (uVar5 < 1000) {
            lVar10 = 0;
            do {
              uVar3 = peVar2->block_energy_histogram[uVar5 + lVar10];
              auVar15._8_4_ = (int)(uVar3 >> 0x20);
              auVar15._0_8_ = uVar3;
              auVar15._12_4_ = 0x45300000;
              dVar11 = dVar11 + ((auVar15._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) *
                                histogram_energies[lVar10 + uVar5];
              lVar8 = lVar8 + uVar3;
              lVar10 = lVar10 + 1;
            } while (1000 - uVar5 != lVar10);
          }
        }
        sVar4 = sVar4 + 1;
      } while (sVar4 != size);
      if (lVar8 != 0) {
        auVar14._8_4_ = (int)((ulong)lVar8 >> 0x20);
        auVar14._0_8_ = lVar8;
        auVar14._12_4_ = 0x45300000;
        dVar13 = log(dVar11 / ((auVar14._8_8_ - 1.9342813113834067e+25) +
                              ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0)));
        local_48 = (dVar13 / 2.302585092994046) * 10.0 + -0.691;
      }
    }
  }
LAB_00107695:
  *out = local_48;
  return 0;
}

Assistant:

static int
ebur128_gated_loudness(ebur128_state** sts, size_t size, double* out) {
  struct ebur128_dq_entry* it;
  double gated_loudness = 0.0;
  double relative_threshold = 0.0;
  size_t above_thresh_counter = 0;
  size_t i, j, start_index;

  for (i = 0; i < size; i++) {
    if (sts[i] && (sts[i]->mode & EBUR128_MODE_I) != EBUR128_MODE_I) {
      return EBUR128_ERROR_INVALID_MODE;
    }
  }

  for (i = 0; i < size; i++) {
    if (!sts[i]) {
      continue;
    }
    ebur128_calc_relative_threshold(sts[i], &above_thresh_counter,
                                    &relative_threshold);
  }
  if (!above_thresh_counter) {
    *out = -HUGE_VAL;
    return EBUR128_SUCCESS;
  }

  relative_threshold /= (double) above_thresh_counter;
  relative_threshold *= relative_gate_factor;

  above_thresh_counter = 0;
  if (relative_threshold < histogram_energy_boundaries[0]) {
    start_index = 0;
  } else {
    start_index = find_histogram_index(relative_threshold);
    if (relative_threshold > histogram_energies[start_index]) {
      ++start_index;
    }
  }
  for (i = 0; i < size; i++) {
    if (!sts[i]) {
      continue;
    }
    if (sts[i]->d->use_histogram) {
      for (j = start_index; j < 1000; ++j) {
        gated_loudness +=
            sts[i]->d->block_energy_histogram[j] * histogram_energies[j];
        above_thresh_counter += sts[i]->d->block_energy_histogram[j];
      }
    } else {
      STAILQ_FOREACH(it, &sts[i]->d->block_list, entries) {
        if (it->z >= relative_threshold) {
          ++above_thresh_counter;
          gated_loudness += it->z;
        }
      }
    }
  }
  if (!above_thresh_counter) {
    *out = -HUGE_VAL;
    return EBUR128_SUCCESS;
  }
  gated_loudness /= (double) above_thresh_counter;
  *out = ebur128_energy_to_loudness(gated_loudness);
  return EBUR128_SUCCESS;
}